

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_stack_restore(ASMState *as,SnapShot *snap)

{
  ulong uVar1;
  int iVar2;
  TValue local_68;
  TValue k;
  Reg local_58;
  Reg src_2;
  Reg src_1;
  Reg src;
  IRIns *ir;
  IRRef ref;
  int32_t ofs;
  BCReg s;
  SnapEntry sn;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap_local;
  ASMState *as_local;
  uint local_10;
  uint local_c;
  
  _nent = as->T->snapmap + snap->mapofs;
  s = (BCReg)snap->nent;
  sn = 0;
  map = &snap->mapofs;
  snap_local = (SnapShot *)as;
  do {
    if (s <= sn) {
      return;
    }
    ofs = _nent[sn];
    ref = (uint)ofs >> 0x18;
    ir._4_4_ = (ref - 2) * 8;
    ir._0_4_ = ofs & 0xffff;
    _src_1 = (IRIns *)(*(long *)(snap_local + 0xc) + (ulong)(uint)ir * 8);
    if ((ofs & 0x40000U) == 0) {
      if ((ofs & 0x100000U) == 0) {
        if (((_src_1->field_1).t.irt & 0x1f) == 0xe) {
          local_58 = ra_alloc1((ASMState *)snap_local,(uint)ir,0xffff0000);
          emit_rmro((ASMState *)snap_local,XO_MOVSDto,local_58,2,ir._4_4_);
        }
        else if ((uint)ir < 0x8000) {
          lj_ir_kvalue(*(lua_State **)(*(long *)&snap_local[0xc].nslots + 0x80),&local_68,_src_1);
          if (CONCAT44(local_68.field_4.it,local_68.field_4.i) == -1) {
            *(undefined4 *)(*(long *)&snap_local[10].nslots + -4) = 0xffffffff;
            *(long *)&snap_local[10].nslots = *(long *)&snap_local[10].nslots + -4;
            emit_rmro((ASMState *)snap_local,XO_MOVmi,0x80200,2,ir._4_4_);
          }
          else {
            emit_movmroi((ASMState *)snap_local,2,ir._4_4_ + 4,local_68.field_4.it);
            emit_movmroi((ASMState *)snap_local,2,ir._4_4_,local_68.field_4.i);
          }
        }
        else {
          k.field_4.it = ra_alloc1((ASMState *)snap_local,(uint)ir,0xbfeb);
          if ((0x605fd9U >> ((_src_1->field_1).t.irt & 0x1f) & 1) == 0) {
            local_10 = (_src_1->field_1).t.irt & 0x1f;
            emit_movmroi((ASMState *)snap_local,2,ir._4_4_ + 4,
                         (local_10 ^ 0xffffffff) << 0xf | 0x7fff);
          }
          else {
            local_c = (_src_1->field_1).t.irt & 0x1f;
            *(uint *)(*(long *)&snap_local[10].nslots + -4) = (local_c ^ 0xffffffff) << 0xf;
            *(long *)&snap_local[10].nslots = *(long *)&snap_local[10].nslots + -4;
            emit_rmro((ASMState *)snap_local,XO_ARITHi,1,2,ir._4_4_ + 4);
          }
          iVar2 = 0;
          if ((0x605fd9U >> ((_src_1->field_1).t.irt & 0x1f) & 1) != 0) {
            iVar2 = 0x80200;
          }
          emit_rmro((ASMState *)snap_local,XO_MOVto,k.field_4.it + iVar2,2,ir._4_4_);
        }
      }
      else {
        emit_movmroi((ASMState *)snap_local,2,ir._4_4_ + 4,-0x18001);
        if ((uint)ir < 0x8000) {
          emit_movmroi((ASMState *)snap_local,2,ir._4_4_,_src_1->i);
        }
        else {
          src_2 = ra_alloc1((ASMState *)snap_local,(uint)ir,0xbfeb);
          emit_rmro((ASMState *)snap_local,XO_MOVto,src_2,2,ir._4_4_);
        }
      }
      as_local = (ASMState *)snap_local;
      uVar1._0_2_ = snap_local[0xb].ref;
      uVar1._2_2_ = snap_local[0xb].mcofs;
      uVar1._4_1_ = snap_local[0xb].nslots;
      uVar1._5_1_ = snap_local[0xb].topslot;
      uVar1._6_1_ = snap_local[0xb].nent;
      uVar1._7_1_ = snap_local[0xb].count;
      if (*(ulong *)&snap_local[10].nslots < uVar1) {
        asm_mclimit((ASMState *)snap_local);
      }
    }
    sn = sn + 1;
  } while( true );
}

Assistant:

static void asm_stack_restore(ASMState *as, SnapShot *snap)
{
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &as->T->snapmap[snap_nextofs(as->T, snap)-1-LJ_FR2];
#endif
  MSize n, nent = snap->nent;
  /* Store the value of all modified slots to the Lua stack. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    int32_t ofs = 8*((int32_t)s-1-LJ_FR2);
    IRRef ref = snap_ref(sn);
    IRIns *ir = IR(ref);
    if ((sn & SNAP_NORESTORE))
      continue;
    if ((sn & SNAP_KEYINDEX)) {
      emit_movmroi(as, RID_BASE, ofs+4, LJ_KEYINDEX);
      if (irref_isk(ref)) {
	emit_movmroi(as, RID_BASE, ofs, ir->i);
      } else {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, RID_BASE));
	emit_movtomro(as, src, RID_BASE, ofs);
      }
    } else if (irt_isnum(ir->t)) {
      Reg src = ra_alloc1(as, ref, RSET_FPR);
      emit_rmro(as, XO_MOVSDto, src, RID_BASE, ofs);
    } else {
      lj_assertA(irt_ispri(ir->t) || irt_isaddr(ir->t) ||
		 (LJ_DUALNUM && irt_isinteger(ir->t)),
		 "restore of IR type %d", irt_type(ir->t));
      if (!irref_isk(ref)) {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, RID_BASE));
#if LJ_GC64
	if (irt_is64(ir->t)) {
	  /* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	  emit_u32(as, irt_toitype(ir->t) << 15);
	  emit_rmro(as, XO_ARITHi, XOg_OR, RID_BASE, ofs+4);
	} else if (LJ_DUALNUM && irt_isinteger(ir->t)) {
	  emit_movmroi(as, RID_BASE, ofs+4, LJ_TISNUM << 15);
	} else {
	  emit_movmroi(as, RID_BASE, ofs+4, (irt_toitype(ir->t)<<15)|0x7fff);
	}
#endif
	emit_movtomro(as, REX_64IR(ir, src), RID_BASE, ofs);
#if LJ_GC64
      } else {
	TValue k;
	lj_ir_kvalue(as->J->L, &k, ir);
	if (tvisnil(&k)) {
	  emit_i32(as, -1);
	  emit_rmro(as, XO_MOVmi, REX_64, RID_BASE, ofs);
	} else {
	  emit_movmroi(as, RID_BASE, ofs+4, k.u32.hi);
	  emit_movmroi(as, RID_BASE, ofs, k.u32.lo);
	}
#else
      } else if (!irt_ispri(ir->t)) {
	emit_movmroi(as, RID_BASE, ofs, ir->i);
#endif
      }
      if ((sn & (SNAP_CONT|SNAP_FRAME))) {
#if !LJ_FR2
	if (s != 0)  /* Do not overwrite link to previous frame. */
	  emit_movmroi(as, RID_BASE, ofs+4, (int32_t)(*flinks--));
#endif
#if !LJ_GC64
      } else {
	if (!(LJ_64 && irt_islightud(ir->t)))
	  emit_movmroi(as, RID_BASE, ofs+4, irt_toitype(ir->t));
#endif
      }
    }
    checkmclim(as);
  }
  lj_assertA(map + nent == flinks, "inconsistent frames in snapshot");
}